

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

Message * __thiscall google::protobuf::DynamicMessage::New(DynamicMessage *this,Arena *arena)

{
  int iVar1;
  undefined4 extraout_var;
  Message *message;
  
  iVar1 = (*(this->super_Message).super_MessageLite._vptr_MessageLite[3])();
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::Message>(arena,(Message *)CONCAT44(extraout_var,iVar1));
  }
  return (Message *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Message* DynamicMessage::New(::google::protobuf::Arena* arena) const {
  if (arena != NULL) {
    Message* message = New();
    arena->Own(message);
    return message;
  } else {
    return New();
  }
}